

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O2

int Saig_ManBmcSimple(Aig_Man_t *pAig,int nFrames,int nSizeMax,int nConfLimit,int fRewrite,
                     int fVerbose,int *piFrame,int nCofFanLit,int fUseSatoko)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Aig_Man_t *p;
  abctime aVar9;
  Aig_Man_t *p_00;
  Cnf_Dat_t *pCnf;
  satoko_t *s;
  void *pvVar10;
  satoko_stats_t *psVar11;
  ABC_INT64_T *pAVar12;
  Vec_Int_t *__ptr;
  int *piVar13;
  sat_solver *s_00;
  Abc_Cex_t *pAVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  int local_cc;
  long local_b8;
  int Lit;
  lit alStack_94 [25];
  
  uVar16 = (ulong)(uint)nFrames;
  aVar8 = Abc_Clock();
  if (nCofFanLit == 0) {
    if (nSizeMax < 1) {
      p = Saig_ManFramesBmc(pAig,nFrames);
    }
    else {
      p = Saig_ManFramesBmcLimit(pAig,nFrames,nSizeMax);
      uVar16 = (ulong)((uint)(0 < p->nObjs[3] % pAig->nTruePos) + p->nObjs[3] / pAig->nTruePos);
    }
  }
  else {
    p = Gia_ManCofactorAig(pAig,nFrames,nCofFanLit);
    if (p == (Aig_Man_t *)0x0) {
      return -1;
    }
  }
  if (piFrame != (int *)0x0) {
    *piFrame = (int)uVar16;
  }
  if (fVerbose != 0) {
    uVar4 = pAig->nRegs;
    uVar1 = pAig->nTruePis;
    uVar2 = pAig->nTruePos;
    iVar5 = pAig->nObjs[6];
    iVar6 = pAig->nObjs[5];
    uVar3 = Aig_ManLevelNum(pAig);
    printf("Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar1,
           (ulong)uVar2,(ulong)uVar4,(ulong)(uint)(iVar5 + iVar6),(ulong)uVar3);
    uVar4 = p->nObjs[2];
    Aig_ManLevelNum(p);
    iVar5 = 0x81b625;
    printf("Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ",uVar16,(ulong)uVar4);
    Abc_Print(iVar5,"%s =","Time");
    aVar9 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar9 - aVar8) / 1000000.0);
    fflush(_stdout);
  }
  p_00 = p;
  if (fRewrite != 0) {
    aVar8 = Abc_Clock();
    p_00 = Dar_ManRwsat(p,1,0);
    Aig_ManStop(p);
    if (fVerbose != 0) {
      iVar5 = p_00->nObjs[6];
      iVar6 = p_00->nObjs[5];
      uVar4 = Aig_ManLevelNum(p_00);
      iVar7 = 0x81b661;
      printf("Time-frames after rewriting:  Node = %6d. Lev = %5d.  ",(ulong)(uint)(iVar5 + iVar6),
             (ulong)uVar4);
      Abc_Print(iVar7,"%s =","Time");
      aVar9 = Abc_Clock();
      Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar9 - aVar8) / 1000000.0);
      fflush(_stdout);
    }
  }
  aVar8 = Abc_Clock();
  pCnf = Cnf_Derive(p_00,p_00->nObjs[3]);
  if (fUseSatoko == 0) {
    s_00 = sat_solver_new();
    sat_solver_setnvars(s_00,pCnf->nVars);
    s = (satoko_t *)0x0;
    lVar15 = 0;
    while (lVar15 < pCnf->nClauses) {
      iVar5 = sat_solver_addclause(s_00,pCnf->pClauses[lVar15],pCnf->pClauses[lVar15 + 1]);
      lVar15 = lVar15 + 1;
      if (iVar5 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc.c"
                      ,0x11c,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
  }
  else {
    satoko_default_opts((satoko_opts_t *)&Lit);
    _Lit = (long)nConfLimit;
    s = satoko_create();
    satoko_configure(s,(satoko_opts_t *)&Lit);
    satoko_setnvars(s,pCnf->nVars);
    lVar15 = 0;
    while (lVar15 < pCnf->nClauses) {
      piVar13 = pCnf->pClauses[lVar15];
      iVar5 = satoko_add_clause(s,piVar13,
                                (int)((ulong)((long)pCnf->pClauses[lVar15 + 1] - (long)piVar13) >> 2
                                     ));
      lVar15 = lVar15 + 1;
      if (iVar5 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc.c"
                      ,0x114,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
    s_00 = (sat_solver *)0x0;
  }
  if (fVerbose != 0) {
    iVar5 = 0x81b6e5;
    printf("CNF: Variables = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)pCnf->nVars,
           (ulong)(uint)pCnf->nClauses,(ulong)(uint)pCnf->nLiterals);
    Abc_Print(iVar5,"%s =","Time");
    aVar9 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar9 - aVar8) / 1000000.0);
    fflush(_stdout);
  }
  if ((s_00 == (sat_solver *)0x0) || (iVar5 = sat_solver_simplify(s_00), iVar5 != 0)) {
    local_b8 = Abc_Clock();
    local_cc = -1;
    for (iVar5 = 0; iVar5 < p_00->vCos->nSize; iVar5 = iVar5 + 1) {
      pvVar10 = Vec_PtrEntry(p_00->vCos,iVar5);
      _Lit = CONCAT44(alStack_94[0],pCnf->pVarNums[*(int *)((long)pvVar10 + 0x24)] * 2);
      if (fVerbose != 0) {
        printf("Solving output %2d of frame %3d ... \r",
               (long)iVar5 % (long)pAig->nTruePos & 0xffffffff,
               (long)iVar5 / (long)pAig->nTruePos & 0xffffffff);
      }
      Abc_Clock();
      if (s == (satoko_t *)0x0) {
        iVar6 = sat_solver_solve(s_00,&Lit,alStack_94,(long)nConfLimit,0,0,0);
      }
      else {
        iVar6 = satoko_solve_assumptions_limit(s,&Lit,1,nConfLimit);
      }
      if (fVerbose != 0) {
        uVar4 = pAig->nTruePos;
        if (iVar5 % (int)uVar4 == uVar4 - 1) {
          printf("Solved %2d outputs of frame %3d.  ",(ulong)uVar4,
                 (long)iVar5 / (long)(int)uVar4 & 0xffffffff);
          if (s_00 == (sat_solver *)0x0) {
            iVar7 = satoko_conflictnum(s);
            dVar17 = (double)iVar7;
            psVar11 = satoko_stats(s);
            pAVar12 = &psVar11->n_propagations;
          }
          else {
            dVar17 = (double)(s_00->stats).conflicts;
            pAVar12 = &(s_00->stats).propagations;
          }
          iVar7 = 0x81b764;
          printf("Conf =%8.0f. Imp =%11.0f. ",dVar17,(double)*pAVar12);
          Abc_Print(iVar7,"%s =","T");
          aVar8 = Abc_Clock();
          Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar8 - local_b8) / 1000000.0);
          local_b8 = Abc_Clock();
          fflush(_stdout);
        }
      }
      if (iVar6 != -1) {
        if (iVar6 == 1) {
          __ptr = Cnf_DataCollectPiSatNums(pCnf,p_00);
          if (s == (satoko_t *)0x0) {
            piVar13 = Sat_SolverGetModel(s_00,__ptr->pArray,__ptr->nSize);
          }
          else {
            piVar13 = Sat2_SolverGetModel(s,__ptr->pArray,__ptr->nSize);
          }
          piVar13[p_00->nObjs[2]] = *(int *)((long)pvVar10 + 0x24);
          pAVar14 = Fra_SmlCopyCounterExample(pAig,p_00,piVar13);
          pAig->pSeqModel = pAVar14;
          free(piVar13);
          free(__ptr->pArray);
          free(__ptr);
          local_cc = 0;
        }
        else {
          local_cc = -1;
        }
        if (piFrame != (int *)0x0) {
          *piFrame = iVar5 / pAig->nTruePos;
        }
        break;
      }
    }
    if (s_00 == (sat_solver *)0x0) goto LAB_004760d8;
  }
  else {
    local_cc = -1;
    if (fVerbose != 0) {
      puts("The BMC problem is trivially UNSAT");
      fflush(_stdout);
    }
  }
  sat_solver_delete(s_00);
LAB_004760d8:
  if (s != (satoko_t *)0x0) {
    satoko_destroy(s);
  }
  Cnf_DataFree(pCnf);
  Aig_ManStop(p_00);
  return local_cc;
}

Assistant:

int Saig_ManBmcSimple( Aig_Man_t * pAig, int nFrames, int nSizeMax, int nConfLimit, int fRewrite, int fVerbose, int * piFrame, int nCofFanLit, int fUseSatoko )
{
    extern Aig_Man_t * Gia_ManCofactorAig( Aig_Man_t * p, int nFrames, int nCofFanLit );
    sat_solver * pSat = NULL;
    satoko_t * pSat2 = NULL;
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pFrames, * pAigTemp;
    Aig_Obj_t * pObj;
    int status, Lit, i, RetValue = -1;
    abctime clk;

    // derive the timeframes
    clk = Abc_Clock();
    if ( nCofFanLit )
    {
        pFrames = Gia_ManCofactorAig( pAig, nFrames, nCofFanLit );
        if ( pFrames == NULL )
            return -1;
    }
    else if ( nSizeMax > 0 )
    {
        pFrames = Saig_ManFramesBmcLimit( pAig, nFrames, nSizeMax );
        nFrames = Aig_ManCoNum(pFrames) / Saig_ManPoNum(pAig) + ((Aig_ManCoNum(pFrames) % Saig_ManPoNum(pAig)) > 0);
    }
    else
        pFrames = Saig_ManFramesBmc( pAig, nFrames );
    if ( piFrame )
        *piFrame = nFrames;
    if ( fVerbose )
    {
        printf( "Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ", 
            nFrames, Aig_ManCiNum(pFrames), Aig_ManCoNum(pFrames), 
            Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    // rewrite the timeframes
    if ( fRewrite )
    {
        clk = Abc_Clock();
//        pFrames = Dar_ManBalance( pAigTemp = pFrames, 0 );
        pFrames = Dar_ManRwsat( pAigTemp = pFrames, 1, 0 );
        Aig_ManStop( pAigTemp );
        if ( fVerbose )
        {
            printf( "Time-frames after rewriting:  Node = %6d. Lev = %5d.  ", 
                Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk );
            fflush( stdout );
        }
    }
    // create the SAT solver
    clk = Abc_Clock();
    pCnf = Cnf_Derive( pFrames, Aig_ManCoNum(pFrames) );  
//if ( s_fInterrupt )
//return -1;
    if ( fUseSatoko )
    {
        satoko_opts_t opts;
        satoko_default_opts(&opts);
        opts.conf_limit = nConfLimit;
        pSat2 = satoko_create();  
        satoko_configure(pSat2, &opts);
        satoko_setnvars(pSat2, pCnf->nVars);
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !satoko_add_clause( pSat2, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
                assert( 0 );
    }
    else
    {
        pSat = sat_solver_new();
        sat_solver_setnvars( pSat, pCnf->nVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
    if ( fVerbose )
    {
        printf( "CNF: Variables = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    status = pSat ? sat_solver_simplify(pSat) : 1;
    if ( status == 0 )
    {
        if ( fVerbose )
        {
            printf( "The BMC problem is trivially UNSAT\n" );
            fflush( stdout );
        }
    }
    else
    {
        abctime clkPart = Abc_Clock();
        Aig_ManForEachCo( pFrames, pObj, i )
        {
            Lit = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
            if ( fVerbose )
            {
                printf( "Solving output %2d of frame %3d ... \r", 
                    i % Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
            }
            clk = Abc_Clock();
            if ( pSat2 )
                status = satoko_solve_assumptions_limit( pSat2, &Lit, 1, nConfLimit );
            else
                status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( fVerbose && (i % Saig_ManPoNum(pAig) == Saig_ManPoNum(pAig) - 1) )
            {
                printf( "Solved %2d outputs of frame %3d.  ", 
                    Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
                printf( "Conf =%8.0f. Imp =%11.0f. ", 
                    (double)(pSat ? pSat->stats.conflicts    : satoko_conflictnum(pSat2)), 
                    (double)(pSat ? pSat->stats.propagations : satoko_stats(pSat2)->n_propagations) );
                ABC_PRT( "T", Abc_Clock() - clkPart );
                clkPart = Abc_Clock();
                fflush( stdout );
            }
            if ( status == l_False )
            {
/*
                Lit = lit_neg( Lit );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
                assert( RetValue );
                if ( pSat->qtail != pSat->qhead )
                {
                    RetValue = sat_solver_simplify(pSat);
                    assert( RetValue );
                }
*/
            }
            else if ( status == l_True )
            {
                Vec_Int_t * vCiIds = Cnf_DataCollectPiSatNums( pCnf, pFrames );
                int * pModel = pSat2 ? Sat2_SolverGetModel(pSat2, vCiIds->pArray, vCiIds->nSize) : Sat_SolverGetModel(pSat, vCiIds->pArray, vCiIds->nSize);
                pModel[Aig_ManCiNum(pFrames)] = pObj->Id;
                pAig->pSeqModel = Fra_SmlCopyCounterExample( pAig, pFrames, pModel );
                ABC_FREE( pModel );
                Vec_IntFree( vCiIds );

                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = 0;
                break;
            }
            else
            {
                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = -1;
                break;
            }
        }
    }
    if ( pSat )  sat_solver_delete( pSat );
    if ( pSat2 ) satoko_destroy( pSat2 );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );
    return RetValue;
}